

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase(FILE *out,TestCase *test_case)

{
  int iVar1;
  TestCase *pTVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  internal *this;
  undefined8 uVar8;
  TestInfo *test_info;
  TimeInMillis ms;
  ostream *local_238;
  String local_1f8;
  stringstream local_1e8 [8];
  stringstream stream;
  ostream aoStack_1d8 [380];
  int local_5c;
  undefined1 local_58 [4];
  int i;
  XmlUnitTestResultPrinter local_28;
  TestCase *test_case_local;
  FILE *out_local;
  
  local_28.output_file_.length_ = (size_t)test_case;
  test_case_local = (TestCase *)out;
  pcVar7 = TestCase::name(test_case);
  EscapeXmlAttribute(&local_28,pcVar7);
  pcVar7 = String::c_str((String *)&local_28);
  uVar3 = TestCase::total_test_count((TestCase *)local_28.output_file_.length_);
  uVar4 = TestCase::failed_test_count((TestCase *)local_28.output_file_.length_);
  uVar5 = TestCase::disabled_test_count((TestCase *)local_28.output_file_.length_);
  fprintf((FILE *)out,"  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" disabled=\"%d\" ",
          pcVar7,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  String::~String((String *)&local_28);
  pTVar2 = test_case_local;
  this = (internal *)TestCase::elapsed_time((TestCase *)local_28.output_file_.length_);
  FormatTimeInMillisAsSeconds_abi_cxx11_((string *)local_58,this,ms);
  uVar8 = std::__cxx11::string::c_str();
  fprintf((FILE *)pTVar2,"errors=\"0\" time=\"%s\">\n",uVar8);
  std::__cxx11::string::~string((string *)local_58);
  local_5c = 0;
  while( true ) {
    iVar1 = local_5c;
    iVar6 = TestCase::total_test_count((TestCase *)local_28.output_file_.length_);
    if (iVar6 <= iVar1) break;
    std::__cxx11::stringstream::stringstream(local_1e8);
    local_238 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1e8) {
      local_238 = aoStack_1d8;
    }
    pcVar7 = TestCase::name((TestCase *)local_28.output_file_.length_);
    test_info = TestCase::GetTestInfo((TestCase *)local_28.output_file_.length_,local_5c);
    OutputXmlTestInfo(local_238,pcVar7,test_info);
    pTVar2 = test_case_local;
    StringStreamToString((internal *)&local_1f8,(stringstream *)local_1e8);
    pcVar7 = String::c_str(&local_1f8);
    fprintf((FILE *)pTVar2,"%s",pcVar7);
    String::~String(&local_1f8);
    std::__cxx11::stringstream::~stringstream(local_1e8);
    local_5c = local_5c + 1;
  }
  fprintf((FILE *)test_case_local,"  </testsuite>\n");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(FILE* out,
                                                const TestCase& test_case) {
  fprintf(out,
          "  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" "
          "disabled=\"%d\" ",
          EscapeXmlAttribute(test_case.name()).c_str(),
          test_case.total_test_count(),
          test_case.failed_test_count(),
          test_case.disabled_test_count());
  fprintf(out,
          "errors=\"0\" time=\"%s\">\n",
          FormatTimeInMillisAsSeconds(test_case.elapsed_time()).c_str());
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    ::std::stringstream stream;
    OutputXmlTestInfo(&stream, test_case.name(), *test_case.GetTestInfo(i));
    fprintf(out, "%s", StringStreamToString(&stream).c_str());
  }
  fprintf(out, "  </testsuite>\n");
}